

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O0

int __thiscall branch_and_reduce_algorithm::packingReduction(branch_and_reduce_algorithm *this)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  bool bVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  __shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar8;
  reference pvVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  reference piVar11;
  vector<int,_std::allocator<int>_> *this_01;
  undefined8 uVar12;
  bool local_261;
  string local_238;
  int local_218;
  int local_214;
  int i_2;
  int i_1;
  int i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_200;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1f8;
  undefined1 local_1f0 [8];
  vector<int,_std::allocator<int>_> copyOfqs;
  iterator iStack_1d0;
  int u_3;
  iterator __end8;
  iterator __begin8;
  value_type *__range8;
  int q;
  vector<int,_std::allocator<int>_> *qs;
  iterator iStack_1a0;
  int u_2;
  iterator __end7_1;
  iterator __begin7_1;
  value_type *__range7_1;
  int p_1;
  int v_1;
  iterator __end5_2;
  iterator __begin5_2;
  value_type *__range5_2;
  int j_7;
  vector<int,_std::allocator<int>_> *count_1;
  int j_6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_148;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_140;
  undefined1 local_138 [8];
  vector<int,_std::allocator<int>_> copyOfTmp;
  iterator iStack_118;
  int w;
  iterator __end7;
  iterator __begin7;
  value_type *__range7;
  int p;
  vector<int,_std::allocator<int>_> *tmp;
  iterator iStack_e8;
  int u_1;
  iterator __end5_1;
  iterator __begin5_1;
  value_type *__range5_1;
  int j_5;
  int u;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  int j_4;
  int j_3;
  vector<int,_std::allocator<int>_> *count;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_98;
  int *local_90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  int local_78;
  uint local_74;
  int v;
  uint j_2;
  vector<int,_std::allocator<int>_> *S;
  int size;
  int sum;
  int max;
  int local_50;
  int local_4c;
  int j_1;
  int j;
  vector<int,_std::allocator<int>_> *ps;
  uint pi;
  int a;
  vector<int,_std::allocator<int>_> x2;
  int oldn;
  branch_and_reduce_algorithm *this_local;
  
  x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
  ._4_4_ = this->rn;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&pi,&this->x);
  ps._4_4_ = -1;
  ps._0_4_ = 0;
  do {
    uVar5 = (ulong)(uint)ps;
    sVar6 = std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::size(&this->packing);
    __stream = _stderr;
    if (sVar6 <= uVar5) {
      if (((2 < debug) && (this->depth <= this->maxDepth)) &&
         (x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ != this->rn)) {
        debugString_abi_cxx11_(&local_238,this);
        uVar12 = std::__cxx11::string::c_str();
        fprintf(__stream,"%spacking: %d -> %d\n",uVar12,
                (ulong)x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_,(ulong)(uint)this->rn);
        std::__cxx11::string::~string((string *)&local_238);
      }
      this_local._4_4_ =
           (uint)(x2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage._4_4_ != this->rn);
LAB_00122248:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&pi);
      return this_local._4_4_;
    }
    _j_1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[](&this->packing,(ulong)(uint)ps);
    if (ps._4_4_ != this->rn) {
      for (local_4c = 0; local_4c < this->N; local_4c = local_4c + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)local_4c);
        vVar1 = *pvVar7;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&pi,(long)local_4c);
        *pvVar7 = vVar1;
      }
      local_50 = this->modifiedN;
      while (local_50 = local_50 + -1, -1 < local_50) {
        this_00 = (__shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  std::
                  vector<std::shared_ptr<modified>,_std::allocator<std::shared_ptr<modified>_>_>::
                  operator[](&this->modifieds,(long)local_50);
        peVar8 = std::__shared_ptr_access<modified,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        (*peVar8->_vptr_modified[3])(peVar8,&pi);
      }
      ps._4_4_ = this->rn;
    }
    sVar6 = std::vector<int,_std::allocator<int>_>::size(_j_1);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_j_1,0);
    size = ((int)sVar6 + -1) - *pvVar7;
    S._4_4_ = 0;
    S._0_4_ = 0;
    _v = &this->level;
    for (local_74 = 1; uVar5 = (ulong)local_74,
        sVar6 = std::vector<int,_std::allocator<int>_>::size(_j_1), uVar5 < sVar6;
        local_74 = local_74 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_j_1,(ulong)local_74);
      local_78 = *pvVar7;
      local_261 = true;
      if ((USE_DEPENDENCY_CHECKING & 1U) != 0) {
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->packingMap,(long)local_78);
        local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar9);
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->packingMap,(long)local_78);
        local_90 = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar9);
        local_80 = std::
                   find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,unsigned_int>
                             (local_88,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        )local_90,(uint *)&ps);
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->packingMap,(long)local_78);
        local_98._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(pvVar9);
        local_261 = __gnu_cxx::operator!=(&local_80,&local_98);
      }
      if (local_261 == false) {
        __assert_fail("!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                      ,0x8e3,"int branch_and_reduce_algorithm::packingReduction()");
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&pi,(long)local_78);
      iVar2 = local_78;
      if (*pvVar7 < 0) {
        sVar6 = (size_type)(int)S;
        S._0_4_ = (int)S + 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,sVar6);
        *pvVar7 = iVar2;
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&pi,(long)local_78);
      if (*pvVar7 == 1) {
        S._4_4_ = S._4_4_ + 1;
      }
    }
    if (size < S._4_4_) {
      this_local._4_4_ = 0xffffffff;
      goto LAB_00122248;
    }
    if ((S._4_4_ == size) && (0 < (int)S)) {
      pvVar10 = &this->iter;
      fast_set::clear(&this->used);
      for (__range5._4_4_ = 0; __range5._4_4_ < (int)S; __range5._4_4_ = __range5._4_4_ + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)__range5._4_4_);
        fast_set::add(&this->used,*pvVar7);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)__range5._4_4_);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)*pvVar7);
        *pvVar7 = -1;
      }
      for (__range5._0_4_ = 0; (int)__range5 < (int)S; __range5._0_4_ = (int)__range5 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)(int)__range5);
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)*pvVar7);
        __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
        _j_5 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           *)&j_5), bVar4) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end5);
          iVar2 = *piVar11;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
          if (*pvVar7 < 0) {
            bVar4 = fast_set::add(&this->used,iVar2);
            if (bVar4) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar2);
              *pvVar7 = 1;
            }
            else {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar2);
              if (*pvVar7 < 0) {
                this_local._4_4_ = 0xffffffff;
                goto LAB_00122248;
              }
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar2);
              *pvVar7 = *pvVar7 + 1;
            }
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end5);
        }
      }
      for (__range5_1._0_4_ = 0; (int)__range5_1 < (int)S; __range5_1._0_4_ = (int)__range5_1 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)(int)__range5_1);
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)*pvVar7);
        __end5_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
        iStack_e8 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
        while (bVar4 = __gnu_cxx::operator!=(&__end5_1,&stack0xffffffffffffff18), bVar4) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end5_1);
          iVar2 = *piVar11;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
          if ((*pvVar7 < 0) &&
             (pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar2),
             *pvVar7 == 1)) {
            this_01 = &this->que;
            __range7._4_4_ = 1;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](this_01,0);
            *pvVar7 = 1;
            pvVar9 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->adj,(long)iVar2);
            __end7 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
            iStack_118 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
            while (bVar4 = __gnu_cxx::operator!=(&__end7,&stack0xfffffffffffffee8), bVar4) {
              piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end7);
              copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = *piVar11;
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&this->x,(long)copyOfTmp.
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_);
              if ((*pvVar7 < 0) &&
                 (bVar4 = fast_set::get(&this->used,
                                        copyOfTmp.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_),
                 vVar1 = copyOfTmp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_, !bVar4)) {
                pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (this_01,(long)__range7._4_4_);
                *pvVar7 = vVar1;
                __range7._4_4_ = __range7._4_4_ + 1;
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end7);
            }
            local_140._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(this_01);
            _j_6 = std::vector<int,_std::allocator<int>_>::begin(this_01);
            local_148 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&j_6,(long)__range7._4_4_);
            std::allocator<int>::allocator((allocator<int> *)((long)&count_1 + 7));
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                      ((vector<int,std::allocator<int>> *)local_138,local_140,local_148,
                       (allocator<int> *)((long)&count_1 + 7));
            std::allocator<int>::~allocator((allocator<int> *)((long)&count_1 + 7));
            pushPacking(this,(vector<int,_std::allocator<int>_> *)local_138);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)local_138);
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end5_1);
        }
      }
      for (count_1._0_4_ = 0; (int)count_1 < (int)S; count_1._0_4_ = (int)count_1 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)(int)count_1);
        if (*pvVar7 == 1) {
          this_local._4_4_ = 0xffffffff;
          goto LAB_00122248;
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)(int)count_1);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)*pvVar7);
        if (-1 < *pvVar7) {
          __assert_fail("x[S[j]] < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                        ,0x91e,"int branch_and_reduce_algorithm::packingReduction()");
        }
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)(int)count_1);
        set(this,*pvVar7,0);
      }
    }
    else if (size < S._4_4_ + (int)S) {
      if ((int)S < 2) {
        __assert_fail("size >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Hespian[P]CutBranching/algo/branch_and_reduce_algorithm.cpp"
                      ,0x924,"int branch_and_reduce_algorithm::packingReduction()");
      }
      pvVar10 = &this->iter;
      fast_set::clear(&this->used);
      for (__range5_2._4_4_ = 0; __range5_2._4_4_ < (int)S; __range5_2._4_4_ = __range5_2._4_4_ + 1)
      {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)__range5_2._4_4_);
        fast_set::add(&this->used,*pvVar7);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)__range5_2._4_4_);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)*pvVar7);
        *pvVar7 = -1;
      }
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,0);
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->adj,(long)*pvVar7);
      __end5_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
      _p_1 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
LAB_00121b9f:
      bVar4 = __gnu_cxx::operator!=
                        (&__end5_2,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&p_1);
      if (bVar4) {
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end5_2);
        iVar2 = *piVar11;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&this->x,(long)iVar2);
        if ((-1 < *pvVar7) || (bVar4 = fast_set::get(&this->used,iVar2), bVar4)) break;
        __range7_1._0_4_ = 0;
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)iVar2);
        __end7_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
        iStack_1a0 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
        while (bVar4 = __gnu_cxx::operator!=(&__end7_1,&stack0xfffffffffffffe60), bVar4) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end7_1);
          iVar3 = *piVar11;
          bVar4 = fast_set::get(&this->used,iVar3);
          if (bVar4) {
            __range7_1._0_4_ = (int)__range7_1 + 1;
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)iVar3);
            *pvVar7 = 1;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end7_1);
        }
        if (S._4_4_ + (int)__range7_1 <= size) {
          if ((((BRANCHING == 10) || (BRANCHING == 0xb)) || (BRANCHING == 0x1f)) &&
             (size < S._4_4_ + 1 + (int)__range7_1)) {
            for (i_2 = 0; i_2 < (int)S; i_2 = i_2 + 1) {
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)i_2);
              pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,(long)*pvVar7);
              if (*pvVar7 == -1) {
                if (BRANCHING == 0x1f) {
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)i_2);
                  std::vector<int,_std::allocator<int>_>::push_back(&this->packing_vtcs,pvVar7);
                }
                else {
                  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)i_2);
                  std::vector<int,_std::allocator<int>_>::push_back(&this->b_vtcs,pvVar7);
                }
              }
            }
          }
          break;
        }
        pvVar10 = &this->que;
        __range8._4_4_ = 1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar10,0);
        *pvVar7 = 2;
        pvVar9 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&this->adj,(long)iVar2);
        __end8 = std::vector<int,_std::allocator<int>_>::begin(pvVar9);
        iStack_1d0 = std::vector<int,_std::allocator<int>_>::end(pvVar9);
        while (bVar4 = __gnu_cxx::operator!=(&__end8,&stack0xfffffffffffffe30), bVar4) {
          piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end8);
          copyOfqs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ = *piVar11;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->x,(long)copyOfqs.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_
                             );
          iVar3 = copyOfqs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
          if (*pvVar7 < 0) {
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar10,(long)__range8._4_4_);
            *pvVar7 = iVar3;
            __range8._4_4_ = __range8._4_4_ + 1;
          }
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end8);
        }
        local_1f8._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar10);
        _i = std::vector<int,_std::allocator<int>_>::begin(pvVar10);
        local_200 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &i,(long)__range8._4_4_);
        std::allocator<int>::allocator((allocator<int> *)((long)&i_1 + 3));
        std::vector<int,std::allocator<int>>::
        vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((vector<int,std::allocator<int>> *)local_1f0,local_1f8,local_200,
                   (allocator<int> *)((long)&i_1 + 3));
        std::allocator<int>::~allocator((allocator<int> *)((long)&i_1 + 3));
        pushPacking(this,(vector<int,_std::allocator<int>_> *)local_1f0);
        set(this,iVar2,1);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)local_1f0);
      }
    }
    if ((((BRANCHING == 10) || (BRANCHING == 0xb || BRANCHING == 0x1f)) && (S._4_4_ == size + -1))
       && (1 < (int)S)) {
      if (BRANCHING == 0x1f) {
        for (local_214 = 0; local_214 < (int)S; local_214 = local_214 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)local_214);
          std::vector<int,_std::allocator<int>_>::push_back(&this->packing_vtcs,pvVar7);
        }
      }
      else {
        for (local_218 = 0; local_218 < (int)S; local_218 = local_218 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_v,(long)local_218);
          std::vector<int,_std::allocator<int>_>::push_back(&this->b_vtcs,pvVar7);
        }
      }
    }
    ps._0_4_ = (uint)ps + 1;
  } while( true );
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
            (&__end5_2);
  goto LAB_00121b9f;
}

Assistant:

int branch_and_reduce_algorithm::packingReduction()
{
    int oldn = rn;
#if 1
    std::vector<int> x2(x);
    int a = -1;
    for (unsigned int pi = 0; pi < packing.size(); ++pi)
    {
        std::vector<int> &ps = packing[pi];
        if (a != rn)
        {
            for (int j = 0; j < N; j++)
                x2[j] = x[j];
            for (int j = modifiedN - 1; j >= 0; j--)
            {
                modifieds[j]->reverse(x2);
            }
            a = rn;
        }
        int max = ps.size() - 1 - ps[0], sum = 0, size = 0;
        std::vector<int> &S = level;
        for (unsigned int j = 1; j < ps.size(); j++)
        {
            int v = ps[j];
            assert(!USE_DEPENDENCY_CHECKING || std::find(packingMap[v].begin(), packingMap[v].end(), pi) != packingMap[v].end());
            if (x2[v] < 0)
                S[size++] = v;
            if (x2[v] == 1)
                sum++;
        }
        if (sum > max) // constraint not fulfilled => prune branch
        {
            return -1;
        }
        else if (sum == max && size > 0) // set x[v] = 0 for remaining vert.
        {
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int j = 0; j < size; j++) // check if there are adjacent vtcs among remaining vtcs.
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0)
                    {
                        if (used.add(u))
                        {
                            count[u] = 1;
                        }
                        else if (count[u] < 0) // adjacent vtcs => one of them has to be in the vc => prune
                        {
                            return -1;
                        }
                        else
                        {
                            count[u]++;
                        }
                    }
            }
            for (int j = 0; j < size; j++) // create new constraints
            {
                for (int u : adj[S[j]])
                    if (x[u] < 0 && count[u] == 1)
                    {
                        std::vector<int> &tmp = que;
                        int p = 0;
                        tmp[p++] = 1;
                        for (int w : adj[u])
                            if (x[w] < 0 && !used.get(w))
                            {
                                tmp[p++] = w;
                            }
                        std::vector<int> copyOfTmp(tmp.begin(), tmp.begin() + p);
                        pushPacking(copyOfTmp);
                    }
            }
            for (int j = 0; j < size; j++) // set x[v] = 0 for remaining vtcs
            {
                if (S[j] == 1)
                    return -1;
                assert(x[S[j]] < 0);
                set(S[j], 0);
            }
        }
        else if (sum + size > max) // at least one of the remaining vtcs has to be excluded
        {
            assert(size >= 2);
            std::vector<int> &count = iter;
            used.clear();
            for (int j = 0; j < size; j++)
            {
                used.add(S[j]);
                count[S[j]] = -1;
            }
            for (int v : adj[S[0]])
                if (x[v] < 0 && !used.get(v))
                {
                    int p = 0; // number of Neighbours in S[-]
                    for (int u : adj[v])
                        if (used.get(u))
                        {
                            p++;
                            count[u] = 1;
                        }
                    if (sum + p > max) // sum + p > max => v has to be in the vc
                    {
                        std::vector<int> &qs = que;
                        int q = 0;
                        qs[q++] = 2;
                        for (int u : adj[v])
                            if (x[u] < 0)
                                qs[q++] = u;
                        std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                        pushPacking(copyOfqs);
                        set(v, 1);
                        break;
                    }
                    else if (BRANCHING == 10 || BRANCHING == 11 || BRANCHING == 31)
                    {
                        if ((sum + 1 + p) > max)
                        {
                            for (int i = 0; i < size; i++)
                                if (count[S[i]] == -1) {
                                    if (BRANCHING == 31) packing_vtcs.push_back(S[i]);
                                    else b_vtcs.push_back(S[i]);
                                }
                        }
                    }
                }
        }

        if (BRANCHING == 10 || BRANCHING == 11 | BRANCHING == 31)
        {
            if (sum == (max - 1) && size > 1)
            {
                if (BRANCHING == 31) {
                    for (int i = 0; i < size; i++) {
                        packing_vtcs.push_back(S[i]);
                    }
                } else {
                    for (int i = 0; i < size; i++) {
                        b_vtcs.push_back(S[i]);
                    }
                }
            }
        }
    }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%spacking: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif // 0
    return oldn != rn ? 1 : 0;
}